

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::EnforceUniqueDir(cmMakefile *this,string *srcPath,string *binPath)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmGlobalGenerator *this_00;
  ostream *poVar3;
  PolicyID id;
  string local_240;
  string local_220;
  undefined4 local_1fc;
  string local_1f8;
  string local_1d8;
  undefined1 local_1a8 [8];
  ostringstream e;
  cmGlobalGenerator *gg;
  string *binPath_local;
  string *srcPath_local;
  cmMakefile *this_local;
  
  this_00 = GetGlobalGenerator(this);
  bVar1 = cmGlobalGenerator::BinaryDirectoryIsNew(this_00,binPath);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar2 = GetPolicyStatus(this,CMP0013,false);
    switch(PVar2) {
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0xd,id);
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"The binary directory\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)binPath);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"is already used to build a source directory.  ");
      poVar3 = std::operator<<(poVar3,"This command uses it to build source directory\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)srcPath);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"which can generate conflicting build files.  ");
      poVar3 = std::operator<<(poVar3,"CMake does not support this use case but it used ");
      poVar3 = std::operator<<(poVar3,"to work accidentally and is being allowed for ");
      std::operator<<(poVar3,"compatibility.");
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    case OLD:
      this_local._7_1_ = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_220,(cmPolicies *)0xd,id);
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_220);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_220);
    case NEW:
      poVar3 = std::operator<<((ostream *)local_1a8,"The binary directory\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)binPath);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"is already used to build a source directory.  ");
      poVar3 = std::operator<<(poVar3,"It cannot be used to build source directory\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)srcPath);
      poVar3 = std::operator<<(poVar3,"\n");
      std::operator<<(poVar3,"Specify a unique binary directory name.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
    default:
      this_local._7_1_ = false;
    }
    local_1fc = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::EnforceUniqueDir(const std::string& srcPath,
                                  const std::string& binPath) const
{
  // Make sure the binary directory is unique.
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  if (gg->BinaryDirectoryIsNew(binPath)) {
    return true;
  }
  std::ostringstream e;
  switch (this->GetPolicyStatus(cmPolicies::CMP0013)) {
    case cmPolicies::WARN:
      // Print the warning.
      /* clang-format off */
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0013)
        << "\n"
        << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "This command uses it to build source directory\n"
        << "  " << srcPath << "\n"
        << "which can generate conflicting build files.  "
        << "CMake does not support this use case but it used "
        << "to work accidentally and is being allowed for "
        << "compatibility.";
      /* clang-format on */
      this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior does not warn.
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0013) << "\n";
      CM_FALLTHROUGH;
    case cmPolicies::NEW:
      // NEW behavior prints the error.
      /* clang-format off */
      e << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "It cannot be used to build source directory\n"
        << "  " << srcPath << "\n"
        << "Specify a unique binary directory name.";
      /* clang-format on */
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      break;
  }

  return false;
}